

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ekf.hpp
# Opt level: O3

void __thiscall EKF::observe(EKF *this,Vector3f *obs_p,Quaternionf *obs_q)

{
  float fVar1;
  undefined1 auVar2 [16];
  float fVar3;
  float fVar4;
  float fVar5;
  undefined8 *puVar6;
  Index dstRows_1;
  char *pcVar7;
  ActualDstType actualDst;
  Quaternionf dq;
  MatrixXf Q;
  MatrixXf QR;
  MatrixXf R;
  MatrixXf Kt;
  VectorXf dx;
  MatrixXf Sui;
  VectorXf error;
  ActualDstType actualDst_3;
  MatrixXf Su;
  MatrixXf H;
  undefined1 local_168 [8];
  undefined8 uStack_160;
  variable_if_dynamic<long,__1> local_158;
  DenseStorage<float,__1,__1,__1,_0> *local_150;
  variable_if_dynamic<long,__1> local_148;
  variable_if_dynamic<long,__1> vStack_140;
  assign_op<float,_float> *local_138;
  char local_130;
  undefined1 local_128 [8];
  assign_op<float,_float> *paStack_120;
  assign_op<float,_float> *local_118;
  DenseStorage<float,__1,__1,__1,_0> local_108;
  undefined1 local_f0 [16];
  assign_op<float,_float> *local_e0;
  Product<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_0>
  *local_d8;
  Index local_d0;
  undefined1 local_c8 [16];
  Product<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_0>
  *local_b8;
  float *local_b0;
  undefined1 *local_a8;
  Product<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_0>
  local_a0;
  non_const_type local_90;
  Product<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_0>
  local_88;
  MatrixXf *local_78;
  float *local_70;
  Product<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_0>
  *local_68;
  undefined8 local_58;
  float local_50;
  Product<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_0>
  local_48;
  long local_38;
  
  toVec((EKF *)local_f0,&this->gravity,(Quaternionf *)obs_p);
  toVec((EKF *)local_128,&this->gravity,(Quaternionf *)&this->pos);
  local_168 = (undefined1  [8])local_f0;
  uStack_160 = (non_const_type)local_128;
  if ((assign_op<float,_float> *)local_f0._8_8_ != paStack_120) {
    __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float>, const Eigen::Matrix<float, -1, 1>, const Eigen::Matrix<float, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<float>, Lhs = const Eigen::Matrix<float, -1, 1>, Rhs = const Eigen::Matrix<float, -1, 1>]"
                 );
  }
  Eigen::PlainObjectBase<Eigen::Matrix<float,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,_1,1,0,_1,1>const,Eigen::Matrix<float,_1,1,0,_1,1>const>>
            ((PlainObjectBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)&local_88,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
              *)local_168);
  free((void *)local_128);
  free((void *)local_f0._0_8_);
  calcH((MatrixXf *)&local_48,this,&this->qua);
  local_108.m_data = (float *)0x0;
  local_108.m_rows = 0;
  local_108.m_cols = 0;
  Eigen::DenseStorage<float,_-1,_-1,_-1,_0>::resize(&local_108,0x100,0x10,0x10);
  local_168 = (undefined1  [8])local_108.m_rows;
  uStack_160 = (non_const_type)local_108.m_cols;
  local_158.m_value = (ulong)local_158.m_value._4_4_ << 0x20;
  if ((local_108.m_cols | local_108.m_rows) < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, Eigen::Matrix<float, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<float>, MatrixType = Eigen::Matrix<float, -1, -1>]"
                 );
  }
  Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<float,_1,_1,0,_1,_1>>
            ((Matrix<float,__1,__1,_0,__1,__1> *)&local_108,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
              *)local_168,(assign_op<float,_float> *)local_f0);
  local_168 = (undefined1  [8])local_108.m_data;
  uStack_160 = (non_const_type)0x7;
  local_158.m_value = 7;
  local_148.m_value = 0;
  vStack_140.m_value = 0;
  local_138 = (assign_op<float,_float> *)local_108.m_rows;
  local_150 = &local_108;
  if ((6 < local_108.m_rows) && (6 < local_108.m_cols)) {
    local_c8._0_8_ =
         (this->Wu).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data
    ;
    local_c8._8_8_ =
         (this->Wu).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_rows
    ;
    if (((Product<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_0>
          *)local_c8._8_8_ !=
         (Product<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_0>
          *)0x7) ||
       ((this->Wu).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols
        != 7)) goto LAB_0010fcf3;
    local_128 = (undefined1  [8])local_108.m_data;
    local_118 = (assign_op<float,_float> *)local_108.m_rows;
    local_f0._8_8_ = local_c8;
    local_f0._0_8_ = (EKF *)local_128;
    local_e0 = (assign_op<float,_float> *)&local_70;
    local_d8 = (Product<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_0>
                *)local_168;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::internal::assign_op<float,_float>,_0>
           *)local_f0);
    if ((this->Pu).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols
        != local_38) {
      pcVar7 = 
      "Eigen::Product<Eigen::Matrix<float, -1, -1>, Eigen::Transpose<Eigen::Matrix<float, -1, -1>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<float, -1, -1>, Rhs = Eigen::Transpose<Eigen::Matrix<float, -1, -1>>, Option = 0]"
      ;
      goto LAB_0010fdfd;
    }
    local_a0.m_lhs = &this->Pu;
    local_148.m_value = local_108.m_rows + -9;
    local_168 = (undefined1  [8])((long)((Vector3f *)local_108.m_data + -3) + local_108.m_rows * 4);
    uStack_160 = (non_const_type)0x9;
    local_158.m_value = 7;
    vStack_140.m_value = 0;
    local_138 = (assign_op<float,_float> *)local_108.m_rows;
    local_150 = &local_108;
    local_a0.m_rhs.m_matrix = (non_const_type)&local_48;
    local_78 = local_a0.m_lhs;
    if ((8 < local_108.m_rows) && (6 < local_108.m_cols)) {
      Eigen::Matrix<float,-1,-1,0,-1,-1>::
      Matrix<Eigen::Product<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>>,0>>
                ((Matrix<float,_1,_1,0,_1,_1> *)local_c8,&local_a0);
      local_70 = (float *)local_c8._0_8_;
      local_68 = (Product<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_0>
                  *)local_c8._8_8_;
      if ((uStack_160 != (non_const_type)local_c8._8_8_) ||
         ((Product<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_0>
           *)local_158.m_value != local_b8)) {
LAB_0010fcf3:
        __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                      "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<float, -1, -1>>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<float, -1, -1>>]"
                     );
      }
      local_128 = local_168;
      local_118 = (assign_op<float,_float> *)local_150->m_rows;
      local_e0 = (assign_op<float,_float> *)&local_b0;
      local_f0._0_8_ = (EKF *)local_128;
      local_f0._8_8_ = (assign_op<float,_float> *)&local_70;
      local_d8 = (Product<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_0>
                  *)local_168;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::internal::assign_op<float,_float>,_0>
             *)local_f0);
      free((void *)local_c8._0_8_);
      local_148.m_value = local_108.m_rows + -9;
      vStack_140.m_value =
           (long)&(((non_const_type)(local_108.m_cols + -0x18))->
                  super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_rows
           + 7;
      local_168 = (undefined1  [8])
                  ((long)((Vector3f *)local_108.m_data + -3) +
                  vStack_140.m_value * local_108.m_rows * 4 + local_108.m_rows * 4);
      uStack_160 = (non_const_type)0x9;
      local_158.m_value = 9;
      local_138 = (assign_op<float,_float> *)local_108.m_rows;
      local_150 = &local_108;
      if ((8 < local_108.m_rows) && (8 < local_108.m_cols)) {
        local_c8._0_8_ =
             (this->Pu).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
             m_data;
        local_c8._8_8_ =
             (this->Pu).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows;
        if (((Product<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_0>
              *)local_c8._8_8_ !=
             (Product<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_0>
              *)0x9) ||
           ((this->Pu).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols != 9)) goto LAB_0010fcf3;
        local_118 = (assign_op<float,_float> *)local_108.m_rows;
        local_128 = local_168;
        local_f0._0_8_ = (EKF *)local_128;
        local_f0._8_8_ = (Matrix<float,_1,_1,0,_1,_1> *)local_c8;
        local_e0 = (assign_op<float,_float> *)&local_70;
        local_d8 = (Product<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_0>
                    *)local_168;
        Eigen::internal::
        dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
        ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::internal::assign_op<float,_float>,_0>
               *)local_f0);
        Eigen::HouseholderQR<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
        HouseholderQR<Eigen::Matrix<float,_1,_1,0,_1,_1>>
                  ((HouseholderQR<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)local_168,
                   (EigenBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)&local_108);
        if (local_130 == '\0') {
          __assert_fail("m_isInitialized && \"HouseholderQR is not initialized.\"",
                        "/usr/include/eigen3/Eigen/src/QR/HouseholderQR.h",0xa5,
                        "HouseholderSequenceType Eigen::HouseholderQR<Eigen::Matrix<float, -1, -1>>::householderQ() const [MatrixType = Eigen::Matrix<float, -1, -1>]"
                       );
        }
        local_f0._8_8_ = &local_150;
        local_d8 = (Product<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_0>
                    *)local_158.m_value;
        if ((long)uStack_160 <= local_158.m_value) {
          local_d8 = (Product<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_0>
                      *)uStack_160;
        }
        local_e0 = (assign_op<float,_float> *)((ulong)local_e0 & 0xffffffffffffff00);
        local_d0 = 0;
        local_128 = (undefined1  [8])0x0;
        paStack_120 = (assign_op<float,_float> *)0x0;
        local_118 = (assign_op<float,_float> *)0x0;
        if ((Product<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_0>
             *)uStack_160 !=
            (Product<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_0>
             *)0x0) {
          if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)uStack_160),
                     0) < (long)uStack_160) {
LAB_0010fd46:
            local_f0._0_8_ = (DstEvaluatorType *)local_168;
            puVar6 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar6 = operator_new;
            __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
          }
          if ((long)uStack_160 < 0) {
            local_f0._0_8_ = (DstEvaluatorType *)local_168;
            __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                          ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                          "void Eigen::PlainObjectBase<Eigen::Matrix<float, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<float, -1, -1>]"
                         );
          }
          auVar2._8_8_ = 0;
          auVar2._0_8_ = uStack_160;
          if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar2,0) < uStack_160)
          goto LAB_0010fd46;
        }
        local_f0._0_8_ = (EKF *)local_168;
        Eigen::DenseStorage<float,_-1,_-1,_-1,_0>::resize
                  ((DenseStorage<float,__1,__1,__1,_0> *)local_128,
                   (long)uStack_160 * (long)uStack_160,(Index)uStack_160,(Index)uStack_160);
        Eigen::PlainObjectBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::operator=
                  ((PlainObjectBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)local_128,
                   (EigenBase<Eigen::HouseholderSequence<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1>_>
                    *)local_f0);
        free((void *)vStack_140.m_value);
        free(local_150);
        free((void *)local_168);
        if (paStack_120 != (assign_op<float,_float> *)local_108.m_rows) {
LAB_0010fd12:
          pcVar7 = 
          "Eigen::Product<Eigen::Transpose<Eigen::Matrix<float, -1, -1>>, Eigen::Matrix<float, -1, -1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Transpose<Eigen::Matrix<float, -1, -1>>, Rhs = Eigen::Matrix<float, -1, -1>, Option = 0]"
          ;
LAB_0010fdfd:
          __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                        ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,pcVar7);
        }
        local_168 = (undefined1  [8])local_128;
        uStack_160 = (non_const_type)&local_108;
        Eigen::PlainObjectBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
        PlainObjectBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>>,Eigen::Matrix<float,_1,_1,0,_1,_1>,0>>
                  ((PlainObjectBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)local_f0,
                   (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0>_>
                    *)local_168);
        vStack_140.m_value = (long)(local_e0 + -9);
        local_168 = (undefined1  [8])
                    ((((Vector3f *)local_f0._0_8_)->
                     super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).m_storage.m_data.
                     array + local_f0._8_8_ * vStack_140.m_value);
        uStack_160 = (non_const_type)0x7;
        local_158.m_value = 9;
        local_148.m_value = 0;
        local_138 = (assign_op<float,_float> *)local_f0._8_8_;
        local_150 = (DenseStorage<float,__1,__1,__1,_0> *)local_f0;
        if ((8 < (long)local_e0) && (6 < (long)local_f0._8_8_)) {
          Eigen::PlainObjectBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
          PlainObjectBase<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,_1,false>>
                    ((PlainObjectBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)local_c8,
                     (DenseBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                      *)local_168);
          local_168 = (undefined1  [8])local_f0._0_8_;
          uStack_160 = (non_const_type)0x7;
          local_158.m_value = 7;
          local_148.m_value = 0;
          vStack_140.m_value = 0;
          local_138 = (assign_op<float,_float> *)local_f0._8_8_;
          local_150 = (DenseStorage<float,__1,__1,__1,_0> *)local_f0;
          if ((6 < (long)local_f0._8_8_) && (6 < (long)local_e0)) {
            Eigen::PlainObjectBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
            PlainObjectBase<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,_1,false>>
                      ((PlainObjectBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)&local_70,
                       (DenseBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                        *)local_168);
            local_b0 = (float *)&local_58;
            local_168 = (undefined1  [8])0x7;
            uStack_160 = (non_const_type)0x7;
            local_a8 = local_168;
            local_58 = (PlainObjectBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)&local_70;
            Eigen::PlainObjectBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
            PlainObjectBase<Eigen::Solve<Eigen::TriangularView<Eigen::Matrix<float,_1,_1,0,_1,_1>,2u>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,_1,_1,0,_1,_1>>>>
                      ((PlainObjectBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)&local_a0,
                       (DenseBase<Eigen::Solve<Eigen::TriangularView<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_2U>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>_>
                        *)&local_b0);
            local_148.m_value = local_f0._8_8_ + -9;
            vStack_140.m_value = (long)(local_e0 + -9);
            local_168 = (undefined1  [8])
                        ((long)((Vector3f *)local_f0._0_8_ + -3) +
                        vStack_140.m_value * local_f0._8_8_ * 4 + local_f0._8_8_ * 4);
            uStack_160 = (non_const_type)0x9;
            local_158.m_value = 9;
            local_138 = (assign_op<float,_float> *)local_f0._8_8_;
            local_150 = (DenseStorage<float,__1,__1,__1,_0> *)local_f0;
            if ((8 < (long)local_f0._8_8_) && (8 < (long)local_e0)) {
              Eigen::internal::
              call_dense_assignment_loop<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::internal::assign_op<float,float>>
                        (local_78,(Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false> *)
                                  local_168,(assign_op<float,_float> *)&local_b0);
              if ((non_const_type)local_c8._8_8_ == local_a0.m_rhs.m_matrix) {
                local_158.m_value = (long)&local_88;
                local_168 = (undefined1  [8])local_c8;
                uStack_160 = (non_const_type)&local_a0;
                if (local_90 != local_88.m_rhs.m_matrix) {
                  pcVar7 = 
                  "Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float, -1, -1>>, Eigen::Matrix<float, -1, -1>>, Eigen::Matrix<float, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Product<Eigen::Transpose<Eigen::Matrix<float, -1, -1>>, Eigen::Matrix<float, -1, -1>>, Rhs = Eigen::Matrix<float, -1, 1>, Option = 0]"
                  ;
                  goto LAB_0010fdfd;
                }
                Eigen::PlainObjectBase<Eigen::Matrix<float,-1,1,0,-1,1>>::
                PlainObjectBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>>,Eigen::Matrix<float,_1,_1,0,_1,_1>,0>,Eigen::Matrix<float,_1,1,0,_1,1>,0>>
                          ((PlainObjectBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)&local_b0,
                           (DenseBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0>_>
                            *)local_168);
                if (2 < (long)local_a8) {
                  local_58 = (PlainObjectBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)
                             CONCAT44(local_b0[(long)(local_a8 + -2)],
                                      local_b0[(long)(local_a8 + -3)]);
                  local_50 = local_b0[(long)(local_a8 + -1)];
                  exp((EKF *)local_168,(double)(ulong)(uint)local_50);
                  if (2 < (long)local_a8) {
                    fVar1 = (this->pos).super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                            m_storage.m_data.array[1];
                    (this->pos).super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data.array[0] =
                         (this->pos).super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                         m_storage.m_data.array[0] + *local_b0;
                    (this->pos).super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data.array[1] = fVar1 + local_b0[1];
                    (this->pos).super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data.array[2] =
                         (this->pos).super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                         m_storage.m_data.array[2] + local_b0[2];
                    if ((undefined1 *)0x2 < local_a8 + -3) {
                      fVar1 = (this->vel).
                              super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                              m_data.array[1];
                      (this->vel).super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[0] =
                           (this->vel).super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                           m_storage.m_data.array[0] + local_b0[3];
                      (this->vel).super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[1] = fVar1 + local_b0[4];
                      (this->vel).super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[2] =
                           (this->vel).super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                           m_storage.m_data.array[2] + local_b0[5];
                      fVar1 = (this->qua).m_coeffs.
                              super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                              m_data.array[0];
                      fVar3 = (this->qua).m_coeffs.
                              super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                              m_data.array[1];
                      fVar4 = (this->qua).m_coeffs.
                              super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                              m_data.array[2];
                      fVar5 = (this->qua).m_coeffs.
                              super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                              m_data.array[3];
                      (this->qua).m_coeffs.
                      super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                      array[0] = (float)local_168._0_4_ * fVar5 + (float)uStack_160 * fVar3 +
                                 (uStack_160._4_4_ * fVar1 - (float)local_168._4_4_ * fVar4);
                      (this->qua).m_coeffs.
                      super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                      array[1] = (float)local_168._4_4_ * fVar5 + (float)local_168._0_4_ * fVar4 +
                                 (uStack_160._4_4_ * fVar3 - (float)uStack_160 * fVar1);
                      (this->qua).m_coeffs.
                      super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                      array[2] = (float)uStack_160 * fVar5 + (float)local_168._4_4_ * fVar1 +
                                 (uStack_160._4_4_ * fVar4 - (float)local_168._0_4_ * fVar3);
                      (this->qua).m_coeffs.
                      super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                      array[3] = -((float)local_168._4_4_ * fVar3 + (float)uStack_160 * fVar4) +
                                 (uStack_160._4_4_ * fVar5 - (float)local_168._0_4_ * fVar1);
                      free(local_b0);
                      free(local_a0.m_lhs);
                      free(local_70);
                      free((void *)local_c8._0_8_);
                      free((void *)local_f0._0_8_);
                      free((void *)local_128);
                      free(local_108.m_data);
                      free(local_48.m_lhs);
                      free(local_88.m_lhs);
                      return;
                    }
                    pcVar7 = 
                    "Eigen::Block<Eigen::Matrix<float, -1, 1>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<float, -1, 1>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
                    ;
                    goto LAB_0010fe1c;
                  }
                }
                pcVar7 = 
                "Eigen::Block<Eigen::Matrix<float, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<float, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                ;
                goto LAB_0010fe1c;
              }
              goto LAB_0010fd12;
            }
          }
        }
      }
    }
  }
  pcVar7 = 
  "Eigen::Block<Eigen::Matrix<float, -1, -1>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<float, -1, -1>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
  ;
LAB_0010fe1c:
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,pcVar7);
}

Assistant:

void observe(const Eigen::Vector3f& obs_p, const Eigen::Quaternionf& obs_q)
  {
    // inovation residual vector (7x1)
    Eigen::VectorXf error = toVec(obs_p, obs_q) - toVec(pos, qua);

    // observation jacobian (7x9)
    Eigen::MatrixXf H = calcH(qua);

    // QR decompose
    Eigen::MatrixXf QR(16, 16);
    QR.setZero();
    QR.topLeftCorner(7, 7) = Wu;
    QR.bottomLeftCorner(9, 7) = Pu * H.transpose();  // (9x7)=(9x9)*(9x7)
    QR.bottomRightCorner(9, 9) = Pu;
    Eigen::MatrixXf Q = QR.householderQr().householderQ();  // (16x16)
    Eigen::MatrixXf R = Q.transpose() * QR;                 // (16x16)

    Eigen::MatrixXf Kt = R.topRightCorner(7, 9);             // (7x9) upper trianguler matrix of the modified Kalman gain
    Eigen::MatrixXf Su = R.topLeftCorner(7, 7);              // (7x7) upper trianguler matrix of the inovation matrix
    Eigen::MatrixXf Sui = Su.triangularView<Eigen::Upper>()  // (7x7) inverse of the upper trianguler of the inovation matrix
                              .solve(Eigen::MatrixXf::Identity(7, 7));

    // update variance covariance matrix
    Pu = R.bottomRightCorner(9, 9);

    Eigen::VectorXf dx = (Kt.transpose() * Sui) * error;  // (9x1)=(9x7)*(7x7)*(7x1)

    // updata state vector
    Eigen::Quaternionf dq = exp(dx.bottomRows(3));
    pos = pos + dx.topRows(3);
    vel = vel + dx.block(3, 0, 3, 1);
    qua = qua * dq;
  }